

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void float64_suite::run(void)

{
  test_zero();
  test_one();
  test_minus_one();
  test_two();
  test_minus_two();
  test_min();
  test_max();
  test_infinity();
  test_minus_infinity();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_two();
    test_minus_two();
    test_min();
    test_max();
    test_infinity();
    test_minus_infinity();
}